

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void __thiscall sliced_chunk_iterator::load_next(sliced_chunk_iterator *this)

{
  uint32_t *puVar1;
  comparer_context *pcVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ostream *poVar9;
  Chunk actual;
  stringstream ss;
  undefined8 local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [88];
  
  local_200 = 0;
  lVar3 = ftell((FILE *)this->ctx->expect);
  if (this->end - lVar3 < 8) {
    (this->current).first = 0;
    (this->current).second = 0;
    this->endit = true;
  }
  else {
    sVar4 = fread(&this->current,4,1,(FILE *)this->ctx->expect);
    sVar5 = fread(&(this->current).second,4,1,(FILE *)this->ctx->expect);
    sVar6 = fread(&local_200,4,1,(FILE *)this->ctx->actual);
    sVar7 = fread((void *)((long)&local_200 + 4),4,1,(FILE *)this->ctx->actual);
    if ((sVar7 << 3 | sVar6 << 2 | sVar5 * 2 | sVar4) != 0xf) {
      pcVar2 = this->ctx;
      local_1b8._0_8_ = (long)local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"IO Error reading chunk head, dumps are malformed","");
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"<ChunkHead>","");
      comparer_context::failure(pcVar2,(string *)local_1b8,&local_1f8);
    }
    if ((this->current).first != (uint)local_200) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      pcVar2 = this->ctx;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Chunk headers do not match. EXPECT: ",0x24);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xffffffb5 | 8;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ACTUAL: ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__cxx11::stringbuf::str();
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"<ChunkHead>","");
      comparer_context::failure(pcVar2,&local_1f8,&local_1d8);
    }
    uVar8 = (ulong)(this->current).second;
    this->next = lVar3 + uVar8 + 8;
    pcVar2 = this->ctx;
    local_1b8._0_8_ = (lVar3 << 0x20 | uVar8) + 0x800000000;
    std::
    deque<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<std::pair<unsigned_int,unsigned_int>>
              ((deque<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&pcVar2->lengths,(pair<unsigned_int,_unsigned_int> *)local_1b8);
    puVar1 = &pcVar2->cnt_chunks;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void load_next() {

        Chunk actual;
        size_t res=0;

        const long cur = ftell(ctx.get_expect());
        if(end-cur<8) {
            current = std::make_pair(0u,0u);
            endit = true;
            return;
        }

        res|=fread(&current.first,4,1,ctx.get_expect());
        res|=fread(&current.second,4,1,ctx.get_expect())    <<1u;
        res|=fread(&actual.first,4,1,ctx.get_actual())      <<2u;
        res|=fread(&actual.second,4,1,ctx.get_actual())     <<3u;

        if(res!=0xf) {
            ctx.failure("IO Error reading chunk head, dumps are malformed","<ChunkHead>");
        }

        if (current.first != actual.first) {
            std::stringstream ss;
            ctx.failure((ss
                <<"Chunk headers do not match. EXPECT: "
                << std::hex << current.first
                <<" ACTUAL: "
                << /*std::hex */actual.first,
                ss.str()),
                "<ChunkHead>");
        }

        if (current.first != actual.first) {
            std::stringstream ss;
            ctx.failure((ss
                <<"Chunk lengths do not match. EXPECT: "
                <<current.second
                <<" ACTUAL: "
                << actual.second,
                ss.str()),
                "<ChunkHead>");
        }

        next = cur+current.second+8;
        ctx.push_length(current.second,cur+8);
    }